

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

destructive_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_int,_NoMemmove>,_int,_Hasher,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SelectKey,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
::destructive_begin(destructive_iterator *__return_storage_ptr__,
                   sparse_hashtable<std::pair<const_int,_NoMemmove>,_int,_Hasher,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SelectKey,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
                   *this)

{
  pointer psVar1;
  pointer psVar2;
  destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>_>
  local_30;
  
  local_30.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.col_current = (pointer)0x0;
  local_30.row_current._M_current = local_30.row_begin._M_current;
  if (local_30.row_begin._M_current != local_30.row_end._M_current) {
    local_30.col_current = (local_30.row_begin._M_current)->group;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>_>
    ::advance_past_end(&local_30);
  }
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->table).groups.
           super__Vector_base<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->pos).row_current._M_current = local_30.row_current._M_current;
  (__return_storage_ptr__->pos).col_current = local_30.col_current;
  (__return_storage_ptr__->pos).row_begin._M_current = local_30.row_begin._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = local_30.row_end._M_current;
  __return_storage_ptr__->ht = this;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  (__return_storage_ptr__->end).row_current._M_current = psVar2;
  (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  sparse_hashtable_destructive_iterator<std::pair<const_int,_NoMemmove>,_int,_Hasher,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SelectKey,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

destructive_iterator destructive_begin() {
    return destructive_iterator(this, table.destructive_begin(),
                                table.destructive_end());
  }